

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O3

link_map * get_vdso_from_aliases(void)

{
  link_map **pplVar1;
  char *__s1;
  int iVar2;
  link_map *plVar3;
  char *__s2;
  char **ppcVar4;
  
  plVar3 = ___throw_regex_error;
  if (___throw_regex_error != (link_map *)0x0) {
    do {
      __s1 = plVar3->l_name;
      ppcVar4 = vdso_aliases;
      __s2 = "linux-vdso.so";
      do {
        ppcVar4 = ppcVar4 + 1;
        if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)) {
          return plVar3;
        }
        __s2 = *ppcVar4;
      } while (__s2 != (char *)0x0);
      pplVar1 = &plVar3->l_next;
      plVar3 = *pplVar1;
    } while (*pplVar1 != (link_map *)0x0);
  }
  return (link_map *)0x0;
}

Assistant:

struct link_map *get_vdso_from_aliases() {
  struct link_map *m = NULL;
  char **aliases = NULL;

  for (m = _r_debug.r_map; m; m = m->l_next) {
    for (aliases = vdso_aliases; *aliases; aliases++) {
      if (m->l_name && gotcha_strcmp(m->l_name, *aliases) == 0) {
        return m;  // GCOVR_EXCL_LINE
      }
    }
  }
  return NULL;
}